

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O3

string * __thiscall
spvtools::val::(anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Instruction *inst)

{
  long lVar1;
  StorageClass operand;
  spv_result_t sVar2;
  ostream *poVar3;
  size_t sVar4;
  string *psVar5;
  Instruction *inst_00;
  char *__s;
  spv_operand_desc desc;
  ostringstream ss;
  undefined1 auStack_1c8 [8];
  string local_1c0;
  long local_1a0 [14];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  GetIdDesc_abi_cxx11_(&local_1c0,(_anonymous_namespace_ *)inst,inst_00);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," uses storage class ",0x14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  lVar1 = *this;
  operand = anon_unknown_0::GetStorageClass
                      ((anon_unknown_0 *)
                       (inst->words_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start,(Instruction *)(ulong)(inst->inst_).opcode);
  local_1c0._M_dataplus._M_p = (pointer)0x0;
  sVar2 = AssemblyGrammar::lookupOperand
                    ((AssemblyGrammar *)(lVar1 + 0x438),SPV_OPERAND_TYPE_STORAGE_CLASS,operand,
                     (spv_operand_desc *)&local_1c0);
  if (sVar2 == SPV_SUCCESS && (long *)local_1c0._M_dataplus._M_p != (long *)0x0) {
    __s = *(char **)local_1c0._M_dataplus._M_p;
    if (__s == (char *)0x0) {
      std::ios::clear((int)auStack_1c8 + (int)*(undefined8 *)(local_1a0[0] + -0x18) + 0x28);
      goto LAB_0063572c;
    }
  }
  else {
    __s = "Unknown";
  }
  sVar4 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,__s,sVar4);
LAB_0063572c:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,".",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  psVar5 = (string *)std::ios_base::~ios_base(local_130);
  return psVar5;
}

Assistant:

std::string BuiltInsValidator::GetStorageClassDesc(
    const Instruction& inst) const {
  std::ostringstream ss;
  ss << GetIdDesc(inst) << " uses storage class ";
  ss << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_STORAGE_CLASS,
                                      uint32_t(GetStorageClass(inst)));
  ss << ".";
  return ss.str();
}